

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

stb_idict * stb_idict_create(void)

{
  int iVar1;
  stb_idict *h;
  
  h = (stb_idict *)malloc(0x38);
  if (h != (stb_idict *)0x0) {
    iVar1 = stb_idict_init(h,0x10);
    if (iVar1 != 0) {
      h->alloced = '\x01';
      return h;
    }
    free(h);
  }
  return (stb_idict *)0x0;
}

Assistant:

stb_define_hash_base(STB_noprefix, stb_idict, short type; short gc; STB_nofields, stb_idict_,stb_idict_,0.85f,
              stb_int32,STB_IEMPTY,STB_IDEL,STB_nocopy,STB_nodelete,STB_nosafe,
              STB_equal,STB_equal,
              return stb_rehash_improved(k);,stb_int32,STB_nonullvalue,0)

stb_idict * stb_idict_new_size(int size)
{
   stb_idict *e = (stb_idict *) malloc(sizeof(*e));
   if (e) {
      if (!stb_is_pow2(size))
         size = 1 << stb_log2_ceil(size);
      stb_idict_init(e, size);
      e->alloced = 1;
   }
   return e;
}